

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O0

HeapType __thiscall
wasm::Random::pick<wasm::HeapType>(Random *this,FeatureOptions<wasm::HeapType> *picker)

{
  value_type *pvVar1;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> local_38;
  FeatureOptions<wasm::HeapType> *local_20;
  FeatureOptions<wasm::HeapType> *picker_local;
  Random *this_local;
  
  local_20 = picker;
  picker_local = (FeatureOptions<wasm::HeapType> *)this;
  items<wasm::HeapType>(&local_38,this,picker);
  pvVar1 = pick<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>(this,&local_38);
  this_local = (Random *)pvVar1->id;
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector(&local_38);
  return (HeapType)(uintptr_t)this_local;
}

Assistant:

const T pick(FeatureOptions<T>& picker) {
    return pick(items(picker));
  }